

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError UTF8ToUTF16(void *vctxt,uchar *outb,int *outlen,uchar *in,int *inlen,int flush)

{
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *outb_local;
  void *vctxt_local;
  
  if (in == (uchar *)0x0) {
    if (*outlen < 2) {
      *outlen = 0;
      *inlen = 0;
      vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
    }
    else {
      *outb = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      vctxt_local._4_4_ = ~XML_ENC_ERR_SPACE;
    }
  }
  else {
    vctxt_local._4_4_ = UTF8ToUTF16LE(vctxt,outb,outlen,in,inlen,flush);
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlCharEncError
UTF8ToUTF16(void *vctxt,
            unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen,
            int flush) {
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(vctxt, outb, outlen, in, inlen, flush));
}